

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSavable.h
# Opt level: O3

TPZSavable * __thiscall
TPZRestoreClass<TPZGeoElement<pzgeom::TPZGeoTriangle,_pzrefine::TPZRefTriangle>_>::Restore
          (TPZRestoreClass<TPZGeoElement<pzgeom::TPZGeoTriangle,_pzrefine::TPZRefTriangle>_> *this)

{
  TPZGeoElRefLess<pzgeom::TPZGeoTriangle> *this_00;
  
  this_00 = (TPZGeoElRefLess<pzgeom::TPZGeoTriangle> *)operator_new(0x128);
  *(undefined ***)&this_00->super_TPZGeoEl = &PTR__TPZSavable_0190ecb0;
  TPZGeoElRefLess<pzgeom::TPZGeoTriangle>::TPZGeoElRefLess(this_00,&PTR_PTR_0190e5a0);
  *(undefined ***)&this_00->super_TPZGeoEl = &PTR__TPZGeoElement_0190e2a0;
  *(undefined4 *)&this_00[1].super_TPZGeoEl = 0xffffffff;
  *(undefined4 *)&this_00[1].super_TPZGeoEl.field_0x4 = 0xffffffff;
  *(undefined4 *)&this_00[1].super_TPZGeoEl.fMesh = 0xffffffff;
  *(undefined4 *)((long)&this_00[1].super_TPZGeoEl.fMesh + 4) = 0xffffffff;
  *(undefined4 *)&this_00[1].super_TPZGeoEl.fId = 0xffffffff;
  *(undefined4 *)((long)&this_00[1].super_TPZGeoEl.fId + 4) = 0xffffffff;
  this_00[1].super_TPZGeoEl.fMatId = -1;
  *(undefined4 *)&this_00[1].super_TPZGeoEl.field_0x1c = 0xffffffff;
  return (TPZSavable *)this_00;
}

Assistant:

virtual TPZSavable *Restore() override {
        T *ptr = new T;
        return ptr;
    }